

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void Test_Template_Expand::Run(void)

{
  bool bVar1;
  int iVar2;
  Template *pTVar3;
  allocator local_c1;
  string output;
  string local_a0;
  TemplateDictionary dict;
  
  std::__cxx11::string::string((string *)&dict,"hi",(allocator *)&output);
  pTVar3 = ctemplate::StringToTemplate((string *)&dict,STRIP_WHITESPACE);
  std::__cxx11::string::~string((string *)&dict);
  ctemplate::TemplateString::TemplateString((TemplateString *)&output,"test_expand");
  ctemplate::TemplateDictionary::TemplateDictionary
            (&dict,(TemplateString *)&output,(UnsafeArena *)0x0);
  std::__cxx11::string::string((string *)&output,"premade",(allocator *)&local_a0);
  bVar1 = ctemplate::Template::Expand(pTVar3,&output,(TemplateDictionaryInterface *)&dict);
  if (bVar1) {
    iVar2 = strcmp(output._M_dataplus._M_p,"premadehi");
    if (iVar2 == 0) {
      std::__cxx11::string::string((string *)&local_a0,"   lo   ",&local_c1);
      pTVar3 = ctemplate::StringToTemplate(&local_a0,STRIP_WHITESPACE);
      std::__cxx11::string::~string((string *)&local_a0);
      bVar1 = ctemplate::Template::Expand(pTVar3,&output,(TemplateDictionaryInterface *)&dict);
      if (bVar1) {
        iVar2 = strcmp(output._M_dataplus._M_p,"premadehilo");
        if (iVar2 == 0) {
          std::__cxx11::string::~string((string *)&output);
          ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
          return;
        }
        printf("ASSERT FAILED, line %d: %s\n",0x417,"strcmp(output.c_str(), \"premadehilo\") == 0");
        iVar2 = strcmp(output._M_dataplus._M_p,"premadehilo");
        if (iVar2 != 0) {
          __assert_fail("strcmp(output.c_str(), \"premadehilo\") == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                        ,0x417,"static void Test_Template_Expand::Run()");
        }
      }
      else {
        printf("ASSERT FAILED, line %d: %s\n",0x416,"tpl->Expand(&output, &dict)");
        bVar1 = ctemplate::Template::Expand(pTVar3,&output,(TemplateDictionaryInterface *)&dict);
        if (!bVar1) {
          __assert_fail("tpl->Expand(&output, &dict)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                        ,0x416,"static void Test_Template_Expand::Run()");
        }
      }
    }
    else {
      printf("ASSERT FAILED, line %d: %s\n",0x413,"strcmp(output.c_str(), \"premadehi\") == 0");
      iVar2 = strcmp(output._M_dataplus._M_p,"premadehi");
      if (iVar2 != 0) {
        __assert_fail("strcmp(output.c_str(), \"premadehi\") == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                      ,0x413,"static void Test_Template_Expand::Run()");
      }
    }
  }
  else {
    printf("ASSERT FAILED, line %d: %s\n",0x412,"tpl->Expand(&output, &dict)");
    bVar1 = ctemplate::Template::Expand(pTVar3,&output,(TemplateDictionaryInterface *)&dict);
    if (!bVar1) {
      __assert_fail("tpl->Expand(&output, &dict)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x412,"static void Test_Template_Expand::Run()");
    }
  }
  exit(1);
}

Assistant:

TEST(Template, Expand) {
  Template* tpl = StringToTemplate("hi", STRIP_WHITESPACE);
  TemplateDictionary dict("test_expand");
  string output("premade");
  ASSERT(tpl->Expand(&output, &dict));
  ASSERT_STREQ(output.c_str(), "premadehi");

  tpl = StringToTemplate("   lo   ", STRIP_WHITESPACE);
  ASSERT(tpl->Expand(&output, &dict));
  ASSERT_STREQ(output.c_str(), "premadehilo");
}